

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimalintegration.cpp
# Opt level: O2

void __thiscall
QMinimalIntegration::QMinimalIntegration(QMinimalIntegration *this,QStringList *parameters)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  QMinimalScreen *this_00;
  uint uVar4;
  long lVar5;
  QString *param;
  QString *lhs;
  long in_FS_OFFSET;
  QLatin1StringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR__QMinimalIntegration_00108878;
  this->m_fontDatabase = (QPlatformFontDatabase *)0x0;
  (this->m_nativeInterface).d = (QPlatformNativeInterface *)0x0;
  lhs = (parameters->d).ptr;
  uVar4 = 0;
  for (lVar5 = (parameters->d).size * 0x18; lVar5 != 0; lVar5 = lVar5 + -0x18) {
    local_48.m_size = 0xc;
    local_48.m_data = "enable_fonts";
    bVar1 = operator==(lhs,&local_48);
    if (bVar1) {
      uVar4 = uVar4 | 2;
    }
    else {
      local_48.m_size = 8;
      local_48.m_data = "freetype";
      bVar1 = operator==(lhs,&local_48);
      if (bVar1) {
        uVar4 = uVar4 | 4;
      }
      else {
        local_48.m_size = 10;
        local_48.m_data = "fontconfig";
        bVar1 = operator==(lhs,&local_48);
        if (bVar1) {
          uVar4 = uVar4 | 8;
        }
      }
    }
    lhs = lhs + 1;
  }
  this->m_options = uVar4;
  cVar2 = qEnvironmentVariableIsSet("QT_DEBUG_BACKINGSTORE");
  if (cVar2 != '\0') {
    iVar3 = qEnvironmentVariableIntValue("QT_DEBUG_BACKINGSTORE",(bool *)0x0);
    if (0 < iVar3) {
      *(byte *)&this->m_options = (byte)this->m_options | 3;
    }
  }
  this_00 = (QMinimalScreen *)operator_new(0x30);
  QMinimalScreen::QMinimalScreen(this_00);
  this->m_primaryScreen = this_00;
  (this_00->mGeometry).x1 = 0;
  (this_00->mGeometry).y1 = 0;
  (this_00->mGeometry).x2 = 0xef;
  (this_00->mGeometry).y2 = 0x13f;
  this_00->mDepth = 0x20;
  this_00->mFormat = Format_ARGB32_Premultiplied;
  QWindowSystemInterface::handleScreenAdded((QPlatformScreen *)this_00,false);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMinimalIntegration::QMinimalIntegration(const QStringList &parameters)
    : m_fontDatabase(nullptr)
    , m_options(parseOptions(parameters))
{
    if (qEnvironmentVariableIsSet(debugBackingStoreEnvironmentVariable)
        && qEnvironmentVariableIntValue(debugBackingStoreEnvironmentVariable) > 0) {
        m_options |= DebugBackingStore | EnableFonts;
    }

    m_primaryScreen = new QMinimalScreen();

    m_primaryScreen->mGeometry = QRect(0, 0, 240, 320);
    m_primaryScreen->mDepth = 32;
    m_primaryScreen->mFormat = QImage::Format_ARGB32_Premultiplied;

    QWindowSystemInterface::handleScreenAdded(m_primaryScreen);
}